

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

void mcu8str_assign(mcu8str *dest,mcu8str *src)

{
  int iVar1;
  char *__ptr;
  uint uVar2;
  mcu8str local_30;
  
  uVar2 = src->size + 1;
  if (dest->buflen < uVar2) {
    mcu8str_create(&local_30,(ulong)src->size);
    mcu8str_assign(&local_30,src);
    __ptr = dest->c_str;
    dest->c_str = local_30.c_str;
    dest->size = local_30.size;
    dest->buflen = local_30.buflen;
    iVar1 = dest->owns_memory;
    dest->owns_memory = local_30.owns_memory;
    if (__ptr != (char *)0x0 && iVar1 != 0) {
      free(__ptr);
    }
  }
  else {
    memmove(dest->c_str,src->c_str,(ulong)uVar2);
    dest->size = src->size;
  }
  return;
}

Assistant:

void mcu8str_assign( mcu8str* dest, const mcu8str* src )
  {
    if ( src->size +1 <= dest->buflen ) {
      //Already fits. Using memmove in case of self assignment:
      STDNS memmove( dest->c_str, src->c_str, src->size + 1 );
      dest->size = src->size;
      return;
    }
    mcu8str newstr = mcu8str_create( src->size );
    mcu8str_assign( &newstr, src );
    mcu8str_swap( dest, &newstr );
    mcu8str_dealloc( &newstr );
  }